

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

int re2::Regexp::FactorAlternationRecursive(Regexp **sub,int n,ParseFlags altflags,int maxdepth)

{
  ParseFlags flags;
  bool bVar1;
  int iVar2;
  int iVar3;
  Rune lo;
  Rune hi;
  uint uVar4;
  Rune *pRVar5;
  ulong uVar6;
  Regexp *pRVar7;
  Regexp *b;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar8;
  CharClass *pCVar9;
  Rune *pRVar10;
  ostream *poVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int j_1;
  ulong uVar16;
  int j;
  long lVar17;
  int i;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ParseFlags runeflags_i;
  int nrune_i;
  _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
  local_1e8;
  Regexp *x [2];
  
  if (0 < maxdepth) {
    lVar14 = (long)n;
    flags = NoParseFlags;
    uVar20 = 0;
    iVar15 = 0;
    uVar18 = 0;
    pRVar10 = (Rune *)0x0;
    for (uVar16 = 0; lVar12 = (long)iVar15, (long)uVar16 <= lVar14; uVar16 = uVar16 + 1) {
      nrune_i = 0;
      runeflags_i = NoParseFlags;
      if ((long)uVar16 < lVar14) {
        pRVar5 = LeadingString(sub[uVar16],&nrune_i,&runeflags_i);
        if (runeflags_i != flags) goto LAB_001141e7;
        uVar4 = nrune_i;
        if ((int)uVar18 < nrune_i) {
          uVar4 = uVar18;
        }
        uVar6 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar6 = 0;
        }
        for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
          if (pRVar10[uVar13] != pRVar5[uVar13]) {
            uVar6 = uVar13 & 0xffffffff;
            break;
          }
        }
        uVar4 = (uint)uVar6;
        if ((uint)uVar6 == 0) goto LAB_001141e7;
      }
      else {
        pRVar5 = (Rune *)0x0;
LAB_001141e7:
        iVar3 = (int)uVar20;
        if (uVar16 != uVar20) {
          if (uVar16 == iVar3 + 1) {
            iVar15 = iVar15 + 1;
            sub[lVar12] = sub[iVar3];
          }
          else {
            x[0] = LiteralString(pRVar10,uVar18,flags);
            for (lVar17 = (long)iVar3; lVar17 < (long)uVar16; lVar17 = lVar17 + 1) {
              RemoveLeadingString(sub[lVar17],uVar18);
            }
            iVar2 = FactorAlternationRecursive
                              (sub + iVar3,(int)uVar16 - iVar3,altflags,maxdepth + -1);
            x[1] = AlternateNoFactor(sub + iVar3,iVar2,altflags);
            pRVar7 = Concat(x,2,altflags);
            iVar15 = iVar15 + 1;
            sub[lVar12] = pRVar7;
          }
        }
        uVar4 = uVar18;
        if ((long)uVar16 < lVar14) {
          uVar20 = uVar16 & 0xffffffff;
          pRVar10 = pRVar5;
          uVar4 = nrune_i;
          flags = runeflags_i;
        }
      }
      uVar18 = uVar4;
    }
    uVar16 = 0;
    iVar15 = 0;
    pRVar7 = (Regexp *)0x0;
    for (uVar20 = 0; lVar14 = (long)iVar15, (long)uVar20 <= lVar12; uVar20 = uVar20 + 1) {
      b = pRVar7;
      if ((((long)uVar20 < lVar12) && (b = LeadingRegexp(sub[uVar20]), pRVar7 != (Regexp *)0x0)) &&
         (bVar1 = Equal(pRVar7,b), bVar1)) {
        if (8 < pRVar7->op_ - 0xc) {
          if (pRVar7->op_ == 10) {
            iVar3 = min(pRVar7);
            iVar2 = max(pRVar7);
            if (iVar3 == iVar2) {
              if (pRVar7->nsub_ < 2) {
                paVar8 = &pRVar7->field_5;
              }
              else {
                paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar7->field_5).submany_;
              }
              if ((paVar8->subone_->op_ < 0x15) &&
                 ((0x103008U >> (paVar8->subone_->op_ & 0x1f) & 1) != 0)) goto LAB_0011443c;
            }
          }
          goto LAB_00114387;
        }
      }
      else {
LAB_00114387:
        iVar3 = (int)uVar16;
        if (uVar20 != uVar16) {
          if (uVar20 == iVar3 + 1) {
            iVar15 = iVar15 + 1;
            sub[lVar14] = sub[iVar3];
          }
          else {
            x[0] = Incref(pRVar7);
            for (lVar17 = (long)iVar3; lVar17 < (long)uVar20; lVar17 = lVar17 + 1) {
              pRVar7 = RemoveLeadingRegexp(sub[lVar17]);
              sub[lVar17] = pRVar7;
            }
            iVar2 = FactorAlternationRecursive
                              (sub + iVar3,(int)uVar20 - iVar3,altflags,maxdepth + -1);
            x[1] = AlternateNoFactor(sub + iVar3,iVar2,altflags);
            pRVar7 = Concat(x,2,altflags);
            iVar15 = iVar15 + 1;
            sub[lVar14] = pRVar7;
          }
        }
        pRVar7 = b;
        if ((long)uVar20 < lVar12) {
          uVar16 = uVar20 & 0xffffffff;
        }
      }
LAB_0011443c:
    }
    uVar4 = 0;
    uVar18 = 0;
    for (uVar16 = 0; (long)uVar16 <= lVar14; uVar16 = uVar16 + 1) {
      if ((lVar14 <= (long)uVar16) || ((sub[uVar16]->op_ != '\x03' && (sub[uVar16]->op_ != '\x14')))
         ) {
        uVar19 = uVar18;
        if (uVar16 != uVar4) {
          if (uVar16 == uVar4 + 1) {
            uVar19 = uVar18 + 1;
            sub[(int)uVar18] = sub[(int)uVar4];
          }
          else {
            CharClassBuilder::CharClassBuilder((CharClassBuilder *)&nrune_i);
            for (lVar12 = (long)(int)uVar4; lVar12 < (long)uVar16; lVar12 = lVar12 + 1) {
              pRVar7 = sub[lVar12];
              if (pRVar7->op_ == '\x03') {
                lo = rune(pRVar7);
                hi = rune(pRVar7);
                CharClassBuilder::AddRangeFlags
                          ((CharClassBuilder *)&nrune_i,lo,hi,(uint)pRVar7->parse_flags_);
              }
              else if (pRVar7->op_ == '\x14') {
                pCVar9 = cc(pRVar7);
                pRVar10 = *(Rune **)(pCVar9 + 8);
                for (pRVar5 = pRVar10; pRVar5 != pRVar10 + (long)*(int *)(pCVar9 + 0x10) * 2;
                    pRVar5 = pRVar5 + 2) {
                  CharClassBuilder::AddRange((CharClassBuilder *)&nrune_i,*pRVar5,pRVar5[1]);
                  pRVar10 = *(Rune **)(pCVar9 + 8);
                }
              }
              else {
                LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)x,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc"
                           ,0x409);
                poVar11 = std::operator<<((ostream *)(x + 1),"RE2: unexpected op: ");
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,(uint)pRVar7->op_);
                poVar11 = std::operator<<(poVar11," ");
                ToString_abi_cxx11_((string *)&runeflags_i,pRVar7);
                std::operator<<(poVar11,(string *)&runeflags_i);
                std::__cxx11::string::~string((string *)&runeflags_i);
                LogMessageFatal::~LogMessageFatal((LogMessageFatal *)x);
              }
              Decref(pRVar7);
            }
            pCVar9 = CharClassBuilder::GetCharClass((CharClassBuilder *)&nrune_i);
            pRVar7 = NewCharClass(pCVar9,altflags);
            uVar19 = uVar18 + 1;
            sub[(int)uVar18] = pRVar7;
            std::
            _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
            ::~_Rb_tree(&local_1e8);
          }
        }
        if ((long)uVar16 < lVar14) {
          lVar12 = (long)(int)uVar19;
          uVar19 = uVar19 + 1;
          sub[lVar12] = sub[uVar16];
        }
        uVar4 = (int)uVar16 + 1;
        uVar18 = uVar19;
      }
    }
    uVar16 = 0;
    if (0 < (int)uVar18) {
      uVar16 = (ulong)uVar18;
    }
    uVar20 = 0;
    lVar14 = 0;
    while( true ) {
      n = (int)uVar20;
      lVar12 = lVar14 + 1;
      if (lVar12 - uVar16 == 1) break;
      pRVar7 = sub[lVar14];
      lVar14 = lVar12;
      if ((((int)lVar12 < (int)uVar18) && (pRVar7->op_ == '\x02')) && (sub[lVar12]->op_ == '\x02'))
      {
        Decref(pRVar7);
      }
      else {
        sub[uVar20] = pRVar7;
        uVar20 = (ulong)(n + 1);
      }
    }
  }
  return n;
}

Assistant:

int Regexp::FactorAlternationRecursive(
    Regexp** sub, int n,
    Regexp::ParseFlags altflags,
    int maxdepth) {

  if (maxdepth <= 0)
    return n;

  // Round 1: Factor out common literal prefixes.
  Rune *rune = NULL;
  int nrune = 0;
  Regexp::ParseFlags runeflags = Regexp::NoParseFlags;
  int start = 0;
  int out = 0;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that all begin
    // with the string rune[0:nrune].

    Rune* rune_i = NULL;
    int nrune_i = 0;
    Regexp::ParseFlags runeflags_i = Regexp::NoParseFlags;
    if (i < n) {
      rune_i = LeadingString(sub[i], &nrune_i, &runeflags_i);
      if (runeflags_i == runeflags) {
        int same = 0;
        while (same < nrune && same < nrune_i && rune[same] == rune_i[same])
          same++;
        if (same > 0) {
          // Matches at least one rune in current range.  Keep going around.
          nrune = same;
          continue;
        }
      }
    }

    // Found end of a run with common leading literal string:
    // sub[start:i] all begin with rune[0:nrune] but sub[i]
    // does not even begin with rune[0].
    //
    // Factor out common string and append factored expression to sub[0:out].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
      sub[out++] = sub[start];
    } else {
      // Construct factored form: prefix(suffix1|suffix2|...)
      Regexp* x[2];  // x[0] = prefix, x[1] = suffix1|suffix2|...
      x[0] = LiteralString(rune, nrune, runeflags);
      for (int j = start; j < i; j++)
        RemoveLeadingString(sub[j], nrune);
      int nn = FactorAlternationRecursive(sub + start, i - start, altflags,
                                          maxdepth - 1);
      x[1] = AlternateNoFactor(sub + start, nn, altflags);
      sub[out++] = Concat(x, 2, altflags);
    }

    // Prepare for next round (if there is one).
    if (i < n) {
      start = i;
      rune = rune_i;
      nrune = nrune_i;
      runeflags = runeflags_i;
    }
  }
  n = out;

  // Round 2: Factor out common simple prefixes,
  // just the first piece of each concatenation.
  // This will be good enough a lot of the time.
  //
  // Complex subexpressions (e.g. involving quantifiers)
  // are not safe to factor because that collapses their
  // distinct paths through the automaton, which affects
  // correctness in some cases.
  start = 0;
  out = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that all begin with first.

    Regexp* first_i = NULL;
    if (i < n) {
      first_i = LeadingRegexp(sub[i]);
      if (first != NULL && Regexp::Equal(first, first_i) &&
          // first must be an empty-width op
          // OR a char class, any char or any byte
          // OR a fixed repeat of a literal, char class, any char or any byte.
          (first->op() == kRegexpBeginLine ||
           first->op() == kRegexpEndLine ||
           first->op() == kRegexpWordBoundary ||
           first->op() == kRegexpNoWordBoundary ||
           first->op() == kRegexpBeginText ||
           first->op() == kRegexpEndText ||
           first->op() == kRegexpCharClass ||
           first->op() == kRegexpAnyChar ||
           first->op() == kRegexpAnyByte ||
           (first->op() == kRegexpRepeat &&
            first->min() == first->max() &&
            (first->sub()[0]->op() == kRegexpLiteral ||
             first->sub()[0]->op() == kRegexpCharClass ||
             first->sub()[0]->op() == kRegexpAnyChar ||
             first->sub()[0]->op() == kRegexpAnyByte)))) {
        continue;
      }
    }

    // Found end of a run with common leading regexp:
    // sub[start:i] all begin with first but sub[i] does not.
    //
    // Factor out common regexp and append factored expression to sub[0:out].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
      sub[out++] = sub[start];
    } else {
      // Construct factored form: prefix(suffix1|suffix2|...)
      Regexp* x[2];  // x[0] = prefix, x[1] = suffix1|suffix2|...
      x[0] = first->Incref();
      for (int j = start; j < i; j++)
        sub[j] = RemoveLeadingRegexp(sub[j]);
      int nn = FactorAlternationRecursive(sub + start, i - start, altflags,
                                   maxdepth - 1);
      x[1] = AlternateNoFactor(sub + start, nn, altflags);
      sub[out++] = Concat(x, 2, altflags);
    }

    // Prepare for next round (if there is one).
    if (i < n) {
      start = i;
      first = first_i;
    }
  }
  n = out;

  // Round 3: Collapse runs of single literals into character classes.
  start = 0;
  out = 0;
  for (int i = 0; i <= n; i++) {
    // Invariant: what was in sub[0:start] has been Decref'ed
    // and that space has been reused for sub[0:out] (out <= start).
    //
    // Invariant: sub[start:i] consists of regexps that are either
    // literal runes or character classes.

    if (i < n &&
        (sub[i]->op() == kRegexpLiteral ||
         sub[i]->op() == kRegexpCharClass))
      continue;

    // sub[i] is not a char or char class;
    // emit char class for sub[start:i]...
    if (i == start) {
      // Nothing to do.
    } else if (i == start+1) {
      sub[out++] = sub[start];
    } else {
      // Make new char class.
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      sub[out++] = NewCharClass(ccb.GetCharClass(), altflags);
    }

    // ... and then emit sub[i].
    if (i < n)
      sub[out++] = sub[i];
    start = i+1;
  }
  n = out;

  // Round 4: Collapse runs of empty matches into single empty match.
  start = 0;
  out = 0;
  for (int i = 0; i < n; i++) {
    if (i + 1 < n &&
        sub[i]->op() == kRegexpEmptyMatch &&
        sub[i+1]->op() == kRegexpEmptyMatch) {
      sub[i]->Decref();
      continue;
    }
    sub[out++] = sub[i];
  }
  n = out;

  return n;
}